

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

void __thiscall argsman_tests::util_ReadWriteSettings::test_method(util_ReadWriteSettings *this)

{
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  DebugLogHelper debugloghelper25;
  TestArgsManager args2;
  TestArgsManager args1;
  DebugLogHelper *in_stack_fffffffffffff908;
  ArgsManager *in_stack_fffffffffffff910;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  *this_00;
  anon_class_1_0_00000001 *in_stack_fffffffffffff920;
  allocator<char> *p1;
  ArgsManager *in_stack_fffffffffffff928;
  ArgsManager *this_01;
  string *in_stack_fffffffffffff940;
  string *in_stack_fffffffffffff948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined8 in_stack_fffffffffffff968;
  allocator<char> local_67d [2];
  allocator<char> local_67b [2];
  allocator<char> local_679 [9];
  undefined8 in_stack_fffffffffffff990;
  undefined8 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff9cf;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffff9d0;
  ArgsManager *in_stack_fffffffffffff9d8;
  path local_600 [2];
  path local_5b0 [36];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffff908);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff958,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffff948);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff910);
  ArgsManager::ForceSetArg(in_RDI,in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::__cxx11::string::~string(&in_stack_fffffffffffff908->m_message);
  std::__cxx11::string::~string(&in_stack_fffffffffffff908->m_message);
  std::allocator<char>::~allocator(local_679);
  ArgsManager::LockSettings<argsman_tests::util_ReadWriteSettings::test_method()::__0>
            (in_stack_fffffffffffff928,in_stack_fffffffffffff920);
  ArgsManager::WriteSettingsFile
            (in_stack_fffffffffffff9d8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9d0._M_head_impl,(bool)in_stack_fffffffffffff9cf);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffff908);
  this_01 = (ArgsManager *)local_67b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff958,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffff948);
  fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff910);
  ArgsManager::ForceSetArg(in_RDI,in_stack_fffffffffffff948,in_stack_fffffffffffff940);
  std::__cxx11::string::~string(&in_stack_fffffffffffff908->m_message);
  std::__cxx11::string::~string(&in_stack_fffffffffffff908->m_message);
  std::allocator<char>::~allocator(local_67b);
  ArgsManager::ReadSettingsFile
            ((ArgsManager *)in_stack_fffffffffffff998,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff990);
  ArgsManager::LockSettings<argsman_tests::util_ReadWriteSettings::test_method()::__1>
            (this_01,in_stack_fffffffffffff920);
  p1 = local_67d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff958,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffff948);
  this_00 = (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
             *)&stack0xfffffffffffff960;
  std::function<bool(std::__cxx11::string_const*)>::
  function<DebugLogHelper::DebugLogHelper(std::__cxx11::string,std::function<bool(std::__cxx11::string_const*)>)::_default_arg_1_::_lambda(std::__cxx11::string_const*)_1_,void>
            (this_00,(anon_class_1_0_00000001 *)in_stack_fffffffffffff910);
  DebugLogHelper::DebugLogHelper
            ((DebugLogHelper *)in_stack_fffffffffffff968,(string *)in_stack_fffffffffffff960,
             (MatchFn *)in_stack_fffffffffffff958);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
               *)in_stack_fffffffffffff908);
  std::__cxx11::string::~string(&in_stack_fffffffffffff908->m_message);
  std::allocator<char>::~allocator(local_67d);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff910);
  fs::operator/((path *)p1,(char *)this_00);
  std::filesystem::remove(local_5b0);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff910);
  fs::operator/((path *)p1,(char *)this_00);
  std::filesystem::create_directory(local_600);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  ArgsManager::WriteSettingsFile
            (in_stack_fffffffffffff9d8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9d0._M_head_impl,(bool)in_stack_fffffffffffff9cf);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff910);
  fs::operator/((path *)p1,(char *)this_00);
  std::filesystem::remove((path *)&stack0xfffffffffffff9b0);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  fs::path::~path((path *)in_stack_fffffffffffff908);
  DebugLogHelper::~DebugLogHelper(in_stack_fffffffffffff908);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffff908);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffff908);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadWriteSettings)
{
    // Test writing setting.
    TestArgsManager args1;
    args1.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args1.LockSettings([&](common::Settings& settings) { settings.rw_settings["name"] = "value"; });
    args1.WriteSettingsFile();

    // Test reading setting.
    TestArgsManager args2;
    args2.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args2.ReadSettingsFile();
    args2.LockSettings([&](common::Settings& settings) { BOOST_CHECK_EQUAL(settings.rw_settings["name"].get_str(), "value"); });

    // Test error logging, and remove previously written setting.
    {
        ASSERT_DEBUG_LOG("Failed renaming settings file");
        fs::remove(args1.GetDataDirBase() / "settings.json");
        fs::create_directory(args1.GetDataDirBase() / "settings.json");
        args2.WriteSettingsFile();
        fs::remove(args1.GetDataDirBase() / "settings.json");
    }
}